

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O1

Layer * ncnn::create_layer(int index)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Layer *pLVar4;
  Layer_final *this;
  
  pLVar4 = create_layer_cpu(index);
  if (pLVar4 == (Layer *)0x0) {
    this = (Layer_final *)0x0;
  }
  else {
    this = (Layer_final *)operator_new(0xd8);
    (this->super_Layer).type._M_dataplus._M_p = (pointer)&(this->super_Layer).type.field_2;
    (this->super_Layer).type._M_string_length = 0;
    (this->super_Layer).type.field_2._M_local_buf[0] = '\0';
    (this->super_Layer).name._M_dataplus._M_p = (pointer)&(this->super_Layer).name.field_2;
    (this->super_Layer).name._M_string_length = 0;
    (this->super_Layer).name.field_2._M_local_buf[0] = '\0';
    (this->super_Layer).one_blob_only = false;
    (this->super_Layer).support_inplace = false;
    (this->super_Layer).support_vulkan = false;
    (this->super_Layer).support_packing = false;
    (this->super_Layer).support_bf16_storage = false;
    (this->super_Layer).support_fp16_storage = false;
    (this->super_Layer).support_int8_storage = false;
    (this->super_Layer).support_image_storage = false;
    (this->super_Layer).support_tensor_storage = false;
    (this->super_Layer).support_reserved_00 = false;
    (this->super_Layer).bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_Layer).bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_Layer).bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_Layer).tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_Layer).tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_Layer).tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_Layer).bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_Layer).bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_Layer).bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_Layer).top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_Layer).top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->super_Layer).top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_Layer).userdata = (void *)0x0;
    (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Layer_final_0064b8c0;
    this->layer_cpu = pLVar4;
    (this->super_Layer).typeindex = index;
    Layer_final::set_layer_properties(this);
    pLVar4 = this->layer_cpu;
    (this->super_Layer).one_blob_only = pLVar4->one_blob_only;
    (this->super_Layer).support_inplace = pLVar4->support_inplace;
    bVar1 = pLVar4->support_bf16_storage;
    bVar2 = pLVar4->support_fp16_storage;
    bVar3 = pLVar4->support_int8_storage;
    (this->super_Layer).support_packing = pLVar4->support_packing;
    (this->super_Layer).support_bf16_storage = bVar1;
    (this->super_Layer).support_fp16_storage = bVar2;
    (this->super_Layer).support_int8_storage = bVar3;
    (this->super_Layer).support_vulkan = false;
    (this->super_Layer).support_image_storage = false;
    (this->super_Layer).support_tensor_storage = false;
  }
  return &this->super_Layer;
}

Assistant:

Layer* create_layer(int index)
{
    Layer* layer_cpu = create_layer_cpu(index);
    if (!layer_cpu)
        return 0;

    Layer_final* layer_final = new Layer_final;
    layer_final->layer_cpu = layer_cpu;

#if NCNN_VULKAN
    layer_final->layer_vulkan = create_layer_vulkan(index);
#endif

    layer_final->typeindex = index;
    layer_final->set_layer_properties();
    layer_final->get_layer_properties();

    return layer_final;
}